

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator fmt::v6::
         vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>
                   (buffer<wchar_t> *out,internal *param_2,wchar_t *param_3,
                   format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                   *param_4,undefined8 param_5,undefined8 param_6)

{
  buffer<wchar_t> *pbVar1;
  basic_string_view<wchar_t> format_str;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  h;
  undefined1 auStack_78 [8];
  internal *local_70;
  wchar_t *local_68;
  undefined4 local_60;
  buffer<wchar_t> *local_58;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *local_50;
  undefined8 local_48;
  void *local_40;
  undefined4 local_38;
  undefined8 local_30;
  undefined4 local_28;
  undefined4 local_18;
  
  local_60 = 0;
  local_40 = (void *)0x0;
  local_38 = 0;
  local_28 = 0;
  local_18 = 0;
  format_str.size_ = (size_t)auStack_78;
  format_str.data_ = param_3;
  local_70 = param_2;
  local_68 = param_3;
  local_58 = out;
  local_50 = param_4;
  local_48 = param_5;
  local_30 = param_6;
  internal::
  parse_format_string<false,wchar_t,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&>
            (param_2,format_str,param_4);
  pbVar1 = local_58;
  if (local_40 != (void *)0x0) {
    operator_delete__(local_40);
  }
  return (iterator)pbVar1;
}

Assistant:

typename Context::iterator vformat_to(
    typename ArgFormatter::range out, basic_string_view<Char> format_str,
    basic_format_args<Context> args,
    internal::locale_ref loc = internal::locale_ref()) {
  format_handler<ArgFormatter, Char, Context> h(out, format_str, args, loc);
  internal::parse_format_string<false>(format_str, h);
  return h.context.out();
}